

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

bool __thiscall MP1Node::recvMembershipList(MP1Node *this,void *env,char *data,int size,char *label)

{
  short port;
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  lVar1 = *(long *)data;
  iVar3 = size + -8;
  iVar4 = (int)lVar1 * 0xe;
  if (SBORROW4(iVar3,iVar4) == iVar3 + (int)lVar1 * -0xe < 0) {
    lVar5 = 0;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    while( true ) {
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar6) break;
      lVar2 = *(long *)((long)data + 8);
      port = *(short *)((long)data + 0xc);
      lVar1 = *(long *)((long)data + 0xe);
      Params::getcurrtime(this->par);
      updateMembershipList(this,(int)lVar2,port,lVar1);
      data = (char *)((long)data + 0xe);
    }
  }
  return iVar4 <= iVar3;
}

Assistant:

bool MP1Node::recvMembershipList(void *env, char *data, int size, const char * label) {

    //get the number of members
    long numberOfMembers;
    memcpy(&numberOfMembers, data, sizeof(long));
    data += sizeof(long);
    size -= sizeof(long);

    if (size < (int)(numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)))) {
        return false;
    }

    //extract each member from data and update own membership list
    MemberListEntry entry;
    for (int i = 0; i < numberOfMembers; i++) {

        memcpy(&entry.id, data, sizeof(int));
        data += sizeof(int);
        memcpy(&entry.port, data, sizeof(short));
        data += sizeof(short);
        memcpy(&entry.heartbeat, data, sizeof(long));
        data += sizeof(long);
        entry.timestamp = par->getcurrtime();

        int id = entry.id;
        short port = entry.port;
        long heartbeat = entry.heartbeat;

        updateMembershipList(id, port, heartbeat);
    }

    return true;
}